

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

int noconflict(ASMState *as,IRRef ref,IROp conflict,int check)

{
  byte bVar1;
  IRIns *pIVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = as->curins;
  iVar3 = 0;
  if (uVar4 <= ref + 0x1f) {
    pIVar2 = as->ir;
    while (uVar4 = uVar4 - 1, ref < uVar4) {
      uVar5 = (ulong)uVar4;
      bVar1 = *(byte *)((long)pIVar2 + uVar5 * 8 + 5);
      if (bVar1 == conflict) {
        return 0;
      }
      if ((check & 1U) != 0) {
        if (bVar1 == IR_NEWREF) {
          return 0;
        }
        if (bVar1 == 0x62) {
          return 0;
        }
      }
      if ((check & 2U) != 0) {
        if (pIVar2[uVar5].field_0.op1 == ref) {
          return 0;
        }
        if (*(ushort *)((long)pIVar2 + uVar5 * 8 + 2) == ref) {
          return 0;
        }
      }
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int noconflict(ASMState *as, IRRef ref, IROp conflict, int check)
{
  IRIns *ir = as->ir;
  IRRef i = as->curins;
  if (i > ref + CONFLICT_SEARCH_LIM)
    return 0;  /* Give up, ref is too far away. */
  while (--i > ref) {
    if (ir[i].o == conflict)
      return 0;  /* Conflict found. */
    else if ((check & 1) && (ir[i].o == IR_NEWREF || ir[i].o == IR_CALLS))
      return 0;
    else if ((check & 2) && (ir[i].op1 == ref || ir[i].op2 == ref))
      return 0;
  }
  return 1;  /* Ok, no conflict. */
}